

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_solver.cpp
# Opt level: O1

void __thiscall
WorldSolver::setup(WorldSolver *this,WorldNode *start_node,WorldNode *end_node,
                  vector<Item_*,_std::allocator<Item_*>_> *starting_inventory)

{
  pointer ppWVar1;
  pointer ppWVar2;
  pointer ppIVar3;
  pointer ppIVar4;
  WorldNode *local_18;
  
  this->_start_node = start_node;
  this->_end_node = end_node;
  local_18 = start_node;
  std::vector<WorldNode*,std::allocator<WorldNode*>>::_M_assign_aux<WorldNode*const*>
            ((vector<WorldNode*,std::allocator<WorldNode*>> *)&this->_nodes_to_explore,&local_18);
  std::vector<Item_*,_std::allocator<Item_*>_>::operator=
            (&this->_starting_inventory,starting_inventory);
  ppWVar1 = (this->_explored_nodes).super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_explored_nodes).super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppWVar1) {
    (this->_explored_nodes).super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppWVar1;
  }
  ppWVar2 = (this->_blocked_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_blocked_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppWVar2) {
    (this->_blocked_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppWVar2;
  }
  ppIVar3 = (this->_reachable_item_sources).
            super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_reachable_item_sources).
      super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppIVar3) {
    (this->_reachable_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppIVar3;
  }
  ppIVar4 = (this->_relevant_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_relevant_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppIVar4) {
    (this->_relevant_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppIVar4;
  }
  ppIVar4 = (this->_inventory).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_inventory).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppIVar4) {
    (this->_inventory).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppIVar4;
  }
  this->_step_count = 0;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::clear(&this->_debug_log);
  return;
}

Assistant:

void WorldSolver::setup(WorldNode* start_node, WorldNode* end_node, const std::vector<Item*>& starting_inventory)
{
    _start_node = start_node;
    _end_node = end_node;
    _nodes_to_explore = { _start_node };
    _starting_inventory = starting_inventory;

    _explored_nodes.clear();
    _blocked_paths.clear();
    _reachable_item_sources.clear();
    _relevant_items.clear();
    _inventory.clear();
    _step_count = 0;
    
    _debug_log.clear();
}